

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::LogToAllLogfiles
               (LogSeverity severity,time_t timestamp,char *message,size_t len)

{
  int i;
  
  if (fLB::FLAGS_logtostderr == '\0') {
    for (; -1 < severity; severity = severity + -1) {
      MaybeLogToLogfile(severity,timestamp,message,len);
    }
    return;
  }
  ColoredWriteToStderr(severity,message,len);
  return;
}

Assistant:

inline void LogDestination::LogToAllLogfiles(LogSeverity severity,
                                             time_t timestamp,
                                             const char* message,
                                             size_t len) {

  if ( FLAGS_logtostderr ) {           // global flag: never log to file
    ColoredWriteToStderr(severity, message, len);
  } else {
    for (int i = severity; i >= 0; --i)
      LogDestination::MaybeLogToLogfile(i, timestamp, message, len);
  }
}